

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test1.cpp
# Opt level: O1

void matrixVectorTest1(void)

{
  ostream *poVar1;
  Vector4T<float> a;
  Vector4T<float> b;
  Matrix4 A;
  Matrix<float,_4UL,_4UL> local_128;
  Matrix<float,_4UL,_4UL> local_e8;
  AffineMatrix4T<float> local_a0;
  Matrix<float,_4UL,_4UL> local_70;
  
  Gs::Matrix<float,_4UL,_4UL>::Identity();
  Gs::AffineMatrix4T<float>::Identity();
  local_70.m_[0xc] =
       local_70.m_[8] * -1.6666666 + local_70.m_[0] * 4.0 + local_70.m_[4] + local_70.m_[4] +
       local_70.m_[0xc];
  local_70.m_[0xd] =
       local_70.m_[9] * -1.6666666 + local_70.m_[1] * 4.0 + local_70.m_[5] + local_70.m_[5] +
       local_70.m_[0xd];
  local_70.m_[0xe] =
       local_70.m_[10] * -1.6666666 + local_70.m_[2] * 4.0 + local_70.m_[6] + local_70.m_[6] +
       local_70.m_[0xe];
  local_70.m_[0xf] =
       local_70.m_[0xb] * -1.6666666 + local_70.m_[3] * 4.0 + local_70.m_[7] + local_70.m_[7] +
       local_70.m_[0xf];
  local_a0.m_[3] = local_a0.m_[3] + local_a0.m_[3];
  local_a0.m_[4] = local_a0.m_[4] + local_a0.m_[4];
  local_a0.m_[5] = local_a0.m_[5] + local_a0.m_[5];
  local_a0.m_[6] = local_a0.m_[6] * 3.0;
  local_a0.m_[7] = local_a0.m_[7] * 3.0;
  local_a0.m_[8] = local_a0.m_[8] * 3.0;
  local_a0.m_[9] =
       local_a0.m_[6] * -1.6666666 + local_a0.m_[3] + local_a0.m_[3] + local_a0.m_[0] * 4.0 +
       local_a0.m_[9];
  local_a0.m_[10] =
       local_a0.m_[7] * -1.6666666 + local_a0.m_[4] + local_a0.m_[4] + local_a0.m_[1] * 4.0 +
       local_a0.m_[10];
  local_a0.m_[0xb] =
       local_a0.m_[8] * -1.6666666 + local_a0.m_[5] + local_a0.m_[5] + local_a0.m_[2] * 4.0 +
       local_a0.m_[0xb];
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"A = ",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  poVar1 = (ostream *)std::ostream::flush();
  poVar1 = Gs::operator<<(poVar1,&local_70);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"B = ",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  poVar1 = (ostream *)std::ostream::flush();
  poVar1 = Gs::Details::ShiftAffineMatrixOStream<Gs::AffineMatrix4T<float>,float>(poVar1,&local_a0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"A^-1 = ",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  poVar1 = (ostream *)std::ostream::flush();
  local_128.m_[0xd] = local_70.m_[0xd];
  local_128.m_[0xc] = local_70.m_[0xc];
  local_128.m_[0xf] = local_70.m_[0xf];
  local_128.m_[0xe] = local_70.m_[0xe];
  local_e8.m_._48_8_ = local_128.m_._48_8_;
  local_e8.m_._56_8_ = local_128.m_._56_8_;
  Gs::Inverse<float>(&local_e8,&local_128);
  poVar1 = Gs::operator<<(poVar1,&local_e8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"A*A^-1 = ",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  poVar1 = (ostream *)std::ostream::flush();
  local_128.m_[0xd] = local_70.m_[0xd];
  local_128.m_[0xc] = local_70.m_[0xc];
  local_128.m_[0xf] = local_70.m_[0xf];
  local_128.m_[0xe] = local_70.m_[0xe];
  local_e8.m_._48_8_ = local_128.m_._48_8_;
  local_e8.m_._56_8_ = local_128.m_._56_8_;
  Gs::Inverse<float>(&local_e8,&local_128);
  Gs::operator*(&local_128,&local_70,&local_e8);
  poVar1 = Gs::operator<<(poVar1,&local_128);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_128.m_[1] =
       local_70.m_[9] * 0.0 + local_70.m_[1] * 0.0 + local_70.m_[5] * 0.0 + local_70.m_[0xd];
  local_128.m_[0] =
       local_70.m_[8] * 0.0 + local_70.m_[0] * 0.0 + local_70.m_[4] * 0.0 + local_70.m_[0xc];
  local_128.m_[3] =
       local_70.m_[0xb] * 0.0 + local_70.m_[3] * 0.0 + local_70.m_[7] * 0.0 + local_70.m_[0xf];
  local_128.m_[2] =
       local_70.m_[10] * 0.0 + local_70.m_[2] * 0.0 + local_70.m_[6] * 0.0 + local_70.m_[0xe];
  local_e8.m_[1] =
       local_a0.m_[7] * 0.0 + local_a0.m_[1] * 0.0 + local_a0.m_[4] * 0.0 + local_a0.m_[10];
  local_e8.m_[0] =
       local_a0.m_[6] * 0.0 + local_a0.m_[0] * 0.0 + local_a0.m_[3] * 0.0 + local_a0.m_[9];
  local_e8.m_[3] = 1.0;
  local_e8.m_[2] =
       local_a0.m_[8] * 0.0 + local_a0.m_[2] * 0.0 + local_a0.m_[5] * 0.0 + local_a0.m_[0xb];
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"a = ",4);
  poVar1 = Gs::operator<<((ostream *)&std::cout,(Vector<float,_4UL> *)&local_128);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"b = ",4);
  poVar1 = Gs::operator<<((ostream *)&std::cout,(Vector<float,_4UL> *)&local_e8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void matrixVectorTest1()
{
    Matrix4 A = Matrix4::Identity();
    AffineMatrix4 B = AffineMatrix4::Identity();

    Translate(A, Vector3(4, 2, -5.0f/3.0f));
    Scale(B, Vector3(1, 2, 3));
    Translate(B, Vector3(4, 2, -5.0f/3.0f));

    #if 1
    std::cout << "A = " << std::endl << A << std::endl;
    std::cout << "B = " << std::endl << B << std::endl;
    std::cout << "A^-1 = " << std::endl << A.Inverse() << std::endl;
    std::cout << "A*A^-1 = " << std::endl << A*A.Inverse() << std::endl;
    #endif

    auto a = TransformVector(A, Vector4(0, 0, 0, 1));
    auto b = TransformVector(B, Vector4(0, 0, 0, 1));

    //Translate(A, a.xyz()*2.0f);
    //Translate(B, a.yxz());

    std::cout << "a = " << a << std::endl;
    std::cout << "b = " << b << std::endl;
}